

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O2

v256 * v256_wideshuffle_8(v256 x,v256 y,v256 pattern)

{
  v256 *in_RDI;
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  v128 alVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  v128 alVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  undefined1 auVar26 [16];
  char cVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  cVar1 = (char)pattern.val[1][0];
  auVar24[0] = -(cVar1 < '\x10');
  cVar2 = pattern.val[1][0]._1_1_;
  auVar24[1] = -(cVar2 < '\x10');
  cVar3 = pattern.val[1][0]._2_1_;
  auVar24[2] = -(cVar3 < '\x10');
  cVar4 = pattern.val[1][0]._3_1_;
  auVar24[3] = -(cVar4 < '\x10');
  cVar5 = pattern.val[1][0]._4_1_;
  auVar24[4] = -(cVar5 < '\x10');
  cVar6 = pattern.val[1][0]._5_1_;
  auVar24[5] = -(cVar6 < '\x10');
  cVar7 = pattern.val[1][0]._6_1_;
  auVar24[6] = -(cVar7 < '\x10');
  cVar8 = pattern.val[1][0]._7_1_;
  auVar24[7] = -(cVar8 < '\x10');
  cVar9 = (char)pattern.val[1][1];
  auVar24[8] = -(cVar9 < '\x10');
  cVar10 = pattern.val[1][1]._1_1_;
  auVar24[9] = -(cVar10 < '\x10');
  cVar11 = pattern.val[1][1]._2_1_;
  auVar24[10] = -(cVar11 < '\x10');
  cVar12 = pattern.val[1][1]._3_1_;
  auVar24[0xb] = -(cVar12 < '\x10');
  cVar13 = pattern.val[1][1]._4_1_;
  auVar24[0xc] = -(cVar13 < '\x10');
  cVar14 = pattern.val[1][1]._5_1_;
  auVar24[0xd] = -(cVar14 < '\x10');
  cVar15 = pattern.val[1][1]._6_1_;
  auVar24[0xe] = -(cVar15 < '\x10');
  cVar16 = pattern.val[1][1]._7_1_;
  auVar24[0xf] = -(cVar16 < '\x10');
  auVar17[0] = -(cVar1 < '0');
  auVar17[1] = -(cVar2 < '0');
  auVar17[2] = -(cVar3 < '0');
  auVar17[3] = -(cVar4 < '0');
  auVar17[4] = -(cVar5 < '0');
  auVar17[5] = -(cVar6 < '0');
  auVar17[6] = -(cVar7 < '0');
  auVar17[7] = -(cVar8 < '0');
  auVar17[8] = -(cVar9 < '0');
  auVar17[9] = -(cVar10 < '0');
  auVar17[10] = -(cVar11 < '0');
  auVar17[0xb] = -(cVar12 < '0');
  auVar17[0xc] = -(cVar13 < '0');
  auVar17[0xd] = -(cVar14 < '0');
  auVar17[0xe] = -(cVar15 < '0');
  auVar17[0xf] = -(cVar16 < '0');
  auVar43 = pshufb((undefined1  [16])y.val[0],(undefined1  [16])pattern.val[1]);
  auVar44[0] = cVar1 + -0x30;
  auVar44[1] = cVar2 + -0x30;
  auVar44[2] = cVar3 + -0x30;
  auVar44[3] = cVar4 + -0x30;
  auVar44[4] = cVar5 + -0x30;
  auVar44[5] = cVar6 + -0x30;
  auVar44[6] = cVar7 + -0x30;
  auVar44[7] = cVar8 + -0x30;
  auVar44[8] = cVar9 + -0x30;
  auVar44[9] = cVar10 + -0x30;
  auVar44[10] = cVar11 + -0x30;
  auVar44[0xb] = cVar12 + -0x30;
  auVar44[0xc] = cVar13 + -0x30;
  auVar44[0xd] = cVar14 + -0x30;
  auVar44[0xe] = cVar15 + -0x30;
  auVar44[0xf] = cVar16 + -0x30;
  auVar20 = pshufb((undefined1  [16])x.val[1],auVar44);
  auVar26[0] = cVar1 + -0x20;
  auVar26[1] = cVar2 + -0x20;
  auVar26[2] = cVar3 + -0x20;
  auVar26[3] = cVar4 + -0x20;
  auVar26[4] = cVar5 + -0x20;
  auVar26[5] = cVar6 + -0x20;
  auVar26[6] = cVar7 + -0x20;
  auVar26[7] = cVar8 + -0x20;
  auVar26[8] = cVar9 + -0x20;
  auVar26[9] = cVar10 + -0x20;
  auVar26[10] = cVar11 + -0x20;
  auVar26[0xb] = cVar12 + -0x20;
  auVar26[0xc] = cVar13 + -0x20;
  auVar26[0xd] = cVar14 + -0x20;
  auVar26[0xe] = cVar15 + -0x20;
  auVar26[0xf] = cVar16 + -0x20;
  auVar46 = pshufb((undefined1  [16])x.val[0],auVar26);
  auVar21 = pblendvb(auVar20,auVar46,auVar17);
  cVar25 = (char)pattern.val[0][0];
  auVar46[0] = -(cVar25 < '\x10');
  cVar27 = pattern.val[0][0]._1_1_;
  auVar46[1] = -(cVar27 < '\x10');
  cVar28 = pattern.val[0][0]._2_1_;
  auVar46[2] = -(cVar28 < '\x10');
  cVar29 = pattern.val[0][0]._3_1_;
  auVar46[3] = -(cVar29 < '\x10');
  cVar30 = pattern.val[0][0]._4_1_;
  auVar46[4] = -(cVar30 < '\x10');
  cVar31 = pattern.val[0][0]._5_1_;
  auVar46[5] = -(cVar31 < '\x10');
  cVar32 = pattern.val[0][0]._6_1_;
  auVar46[6] = -(cVar32 < '\x10');
  cVar33 = pattern.val[0][0]._7_1_;
  auVar46[7] = -(cVar33 < '\x10');
  cVar34 = (char)pattern.val[0][1];
  auVar46[8] = -(cVar34 < '\x10');
  cVar35 = pattern.val[0][1]._1_1_;
  auVar46[9] = -(cVar35 < '\x10');
  cVar36 = pattern.val[0][1]._2_1_;
  auVar46[10] = -(cVar36 < '\x10');
  cVar37 = pattern.val[0][1]._3_1_;
  auVar46[0xb] = -(cVar37 < '\x10');
  cVar38 = pattern.val[0][1]._4_1_;
  auVar46[0xc] = -(cVar38 < '\x10');
  cVar39 = pattern.val[0][1]._5_1_;
  auVar46[0xd] = -(cVar39 < '\x10');
  cVar40 = pattern.val[0][1]._6_1_;
  auVar46[0xe] = -(cVar40 < '\x10');
  cVar41 = pattern.val[0][1]._7_1_;
  auVar46[0xf] = -(cVar41 < '\x10');
  auVar18[0] = -(cVar25 < '0');
  auVar18[1] = -(cVar27 < '0');
  auVar18[2] = -(cVar28 < '0');
  auVar18[3] = -(cVar29 < '0');
  auVar18[4] = -(cVar30 < '0');
  auVar18[5] = -(cVar31 < '0');
  auVar18[6] = -(cVar32 < '0');
  auVar18[7] = -(cVar33 < '0');
  auVar18[8] = -(cVar34 < '0');
  auVar18[9] = -(cVar35 < '0');
  auVar18[10] = -(cVar36 < '0');
  auVar18[0xb] = -(cVar37 < '0');
  auVar18[0xc] = -(cVar38 < '0');
  auVar18[0xd] = -(cVar39 < '0');
  auVar18[0xe] = -(cVar40 < '0');
  auVar18[0xf] = -(cVar41 < '0');
  auVar23[0] = cVar25 + -0x30;
  auVar23[1] = cVar27 + -0x30;
  auVar23[2] = cVar28 + -0x30;
  auVar23[3] = cVar29 + -0x30;
  auVar23[4] = cVar30 + -0x30;
  auVar23[5] = cVar31 + -0x30;
  auVar23[6] = cVar32 + -0x30;
  auVar23[7] = cVar33 + -0x30;
  auVar23[8] = cVar34 + -0x30;
  auVar23[9] = cVar35 + -0x30;
  auVar23[10] = cVar36 + -0x30;
  auVar23[0xb] = cVar37 + -0x30;
  auVar23[0xc] = cVar38 + -0x30;
  auVar23[0xd] = cVar39 + -0x30;
  auVar23[0xe] = cVar40 + -0x30;
  auVar23[0xf] = cVar41 + -0x30;
  auVar17 = pshufb((undefined1  [16])x.val[1],auVar23);
  auVar45[0] = cVar25 + -0x20;
  auVar45[1] = cVar27 + -0x20;
  auVar45[2] = cVar28 + -0x20;
  auVar45[3] = cVar29 + -0x20;
  auVar45[4] = cVar30 + -0x20;
  auVar45[5] = cVar31 + -0x20;
  auVar45[6] = cVar32 + -0x20;
  auVar45[7] = cVar33 + -0x20;
  auVar45[8] = cVar34 + -0x20;
  auVar45[9] = cVar35 + -0x20;
  auVar45[10] = cVar36 + -0x20;
  auVar45[0xb] = cVar37 + -0x20;
  auVar45[0xc] = cVar38 + -0x20;
  auVar45[0xd] = cVar39 + -0x20;
  auVar45[0xe] = cVar40 + -0x20;
  auVar45[0xf] = cVar41 + -0x20;
  auVar20 = pshufb((undefined1  [16])x.val[0],auVar45);
  auVar18 = pblendvb(auVar17,auVar20,auVar18);
  auVar42[0] = cVar1 + -0x10;
  auVar42[1] = cVar2 + -0x10;
  auVar42[2] = cVar3 + -0x10;
  auVar42[3] = cVar4 + -0x10;
  auVar42[4] = cVar5 + -0x10;
  auVar42[5] = cVar6 + -0x10;
  auVar42[6] = cVar7 + -0x10;
  auVar42[7] = cVar8 + -0x10;
  auVar42[8] = cVar9 + -0x10;
  auVar42[9] = cVar10 + -0x10;
  auVar42[10] = cVar11 + -0x10;
  auVar42[0xb] = cVar12 + -0x10;
  auVar42[0xc] = cVar13 + -0x10;
  auVar42[0xd] = cVar14 + -0x10;
  auVar42[0xe] = cVar15 + -0x10;
  auVar42[0xf] = cVar16 + -0x10;
  auVar17 = pshufb((undefined1  [16])y.val[1],auVar42);
  auVar24 = pblendvb(auVar17,auVar43,auVar24);
  auVar43[0] = cVar25 + -0x10;
  auVar43[1] = cVar27 + -0x10;
  auVar43[2] = cVar28 + -0x10;
  auVar43[3] = cVar29 + -0x10;
  auVar43[4] = cVar30 + -0x10;
  auVar43[5] = cVar31 + -0x10;
  auVar43[6] = cVar32 + -0x10;
  auVar43[7] = cVar33 + -0x10;
  auVar43[8] = cVar34 + -0x10;
  auVar43[9] = cVar35 + -0x10;
  auVar43[10] = cVar36 + -0x10;
  auVar43[0xb] = cVar37 + -0x10;
  auVar43[0xc] = cVar38 + -0x10;
  auVar43[0xd] = cVar39 + -0x10;
  auVar43[0xe] = cVar40 + -0x10;
  auVar43[0xf] = cVar41 + -0x10;
  auVar17 = pshufb((undefined1  [16])y.val[1],auVar43);
  auVar20 = pshufb((undefined1  [16])y.val[0],(undefined1  [16])pattern.val[0]);
  auVar17 = pblendvb(auVar17,auVar20,auVar46);
  auVar20[0] = -(cVar1 < ' ');
  auVar20[1] = -(cVar2 < ' ');
  auVar20[2] = -(cVar3 < ' ');
  auVar20[3] = -(cVar4 < ' ');
  auVar20[4] = -(cVar5 < ' ');
  auVar20[5] = -(cVar6 < ' ');
  auVar20[6] = -(cVar7 < ' ');
  auVar20[7] = -(cVar8 < ' ');
  auVar20[8] = -(cVar9 < ' ');
  auVar20[9] = -(cVar10 < ' ');
  auVar20[10] = -(cVar11 < ' ');
  auVar20[0xb] = -(cVar12 < ' ');
  auVar20[0xc] = -(cVar13 < ' ');
  auVar20[0xd] = -(cVar14 < ' ');
  auVar20[0xe] = -(cVar15 < ' ');
  auVar20[0xf] = -(cVar16 < ' ');
  alVar22 = (v128)pblendvb(auVar21,auVar24,auVar20);
  auVar21[0] = -(cVar25 < ' ');
  auVar21[1] = -(cVar27 < ' ');
  auVar21[2] = -(cVar28 < ' ');
  auVar21[3] = -(cVar29 < ' ');
  auVar21[4] = -(cVar30 < ' ');
  auVar21[5] = -(cVar31 < ' ');
  auVar21[6] = -(cVar32 < ' ');
  auVar21[7] = -(cVar33 < ' ');
  auVar21[8] = -(cVar34 < ' ');
  auVar21[9] = -(cVar35 < ' ');
  auVar21[10] = -(cVar36 < ' ');
  auVar21[0xb] = -(cVar37 < ' ');
  auVar21[0xc] = -(cVar38 < ' ');
  auVar21[0xd] = -(cVar39 < ' ');
  auVar21[0xe] = -(cVar40 < ' ');
  auVar21[0xf] = -(cVar41 < ' ');
  alVar19 = (v128)pblendvb(auVar18,auVar17,auVar21);
  in_RDI->val[1] = alVar22;
  in_RDI->val[0] = alVar19;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_wideshuffle_8(v256 x, v256 y, v256 pattern) {
  v128 c16 = v128_dup_8(16);
  v128 c32 = v128_dup_8(32);
  v128 c48 = v128_dup_8(48);
  v128 maskhi16 = v128_cmpgt_s8(c16, pattern.val[1]);
  v128 masklo16 = v128_cmpgt_s8(c16, pattern.val[0]);
  v128 maskhi48 = v128_cmpgt_s8(c48, pattern.val[1]);
  v128 masklo48 = v128_cmpgt_s8(c48, pattern.val[0]);
  v256 r1 = v256_from_v128(
      v128_blend_8(v128_shuffle_8(x.val[1], v128_sub_8(pattern.val[1], c48)),
                   v128_shuffle_8(x.val[0], v128_sub_8(pattern.val[1], c32)),
                   maskhi48),
      v128_blend_8(v128_shuffle_8(x.val[1], v128_sub_8(pattern.val[0], c48)),
                   v128_shuffle_8(x.val[0], v128_sub_8(pattern.val[0], c32)),
                   masklo48));
  v256 r2 = v256_from_v128(
      v128_blend_8(v128_shuffle_8(y.val[1], v128_sub_8(pattern.val[1], c16)),
                   v128_shuffle_8(y.val[0], pattern.val[1]), maskhi16),
      v128_blend_8(v128_shuffle_8(y.val[1], v128_sub_8(pattern.val[0], c16)),
                   v128_shuffle_8(y.val[0], pattern.val[0]), masklo16));
  return v256_blend_8(r1, r2, v256_cmpgt_s8(v256_from_v128(c32, c32), pattern));
}